

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Server_delete(UA_Server *server)

{
  UA_Server *server_local;
  
  UA_Server_deleteAllRepeatedJobs(server);
  UA_SecureChannelManager_deleteMembers(&server->secureChannelManager);
  UA_SessionManager_deleteMembers(&server->sessionManager);
  UA_NodeStore_delete(server->nodestore);
  UA_Array_delete(server->namespaces,server->namespacesSize,UA_TYPES + 0xb);
  UA_Array_delete(server->endpointDescriptions,server->endpointDescriptionsSize,UA_TYPES + 0x9b);
  free(server);
  return;
}

Assistant:

void UA_Server_delete(UA_Server *server) {
    // Delete the timed work
    UA_Server_deleteAllRepeatedJobs(server);

    // Delete all internal data
    UA_SecureChannelManager_deleteMembers(&server->secureChannelManager);
    UA_SessionManager_deleteMembers(&server->sessionManager);
    UA_RCU_LOCK();
    UA_NodeStore_delete(server->nodestore);
    UA_RCU_UNLOCK();
#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_Server_deleteExternalNamespaces(server);
#endif
    UA_Array_delete(server->namespaces, server->namespacesSize, &UA_TYPES[UA_TYPES_STRING]);
    UA_Array_delete(server->endpointDescriptions, server->endpointDescriptionsSize,
                    &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);

#ifdef UA_ENABLE_MULTITHREADING
    pthread_cond_destroy(&server->dispatchQueue_condition);
    pthread_mutex_destroy(&server->dispatchQueue_mutex);
#endif
    UA_free(server);
}